

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirArchive.cpp
# Opt level: O0

void __thiscall gtar::DirArchive::DirArchive(DirArchive *this,string *filename,OpenMode mode)

{
  char *__file;
  runtime_error *this_00;
  long lVar1;
  undefined1 local_2c0 [8];
  string stripped;
  size_t stripLength;
  undefined1 local_271;
  string local_270 [32];
  stringstream local_250 [8];
  stringstream msg;
  ostream local_240 [380];
  int local_c4;
  undefined1 local_c0 [4];
  int result;
  stat dirStat;
  OpenMode mode_local;
  string *filename_local;
  DirArchive *this_local;
  
  Archive::Archive(&this->super_Archive);
  (this->super_Archive)._vptr_Archive = (_func_int **)&PTR__DirArchive_00237d28;
  std::__cxx11::string::string((string *)&this->m_filename,(string *)filename);
  this->m_mode = mode;
  memset(&this->m_createdDirectories,0,0x30);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->m_createdDirectories);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_fileNames);
  if (this->m_mode != Read) {
    __file = (char *)std::__cxx11::string::c_str();
    local_c4 = stat(__file,(stat *)local_c0);
    if (local_c4 == 0) {
      if (((uint)dirStat.st_nlink & 0x4000) == 0) {
        std::__cxx11::stringstream::stringstream(local_250);
        std::operator<<(local_240,"Error opening directory for write (file already exists)");
        local_271 = 1;
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::runtime_error::runtime_error(this_00,local_270);
        local_271 = 0;
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      std::__cxx11::string::string((string *)&stripLength,(string *)&this->m_filename);
      createDirectory((string *)&stripLength);
      std::__cxx11::string::~string((string *)&stripLength);
    }
  }
  lVar1 = std::__cxx11::string::find_last_not_of((char)&this->m_filename,0x2f);
  stripped.field_2._8_8_ = lVar1 + 1;
  std::__cxx11::string::substr((ulong)local_2c0,(ulong)&this->m_filename);
  searchDirectory(this,(string *)local_2c0);
  std::__cxx11::string::~string((string *)local_2c0);
  return;
}

Assistant:

DirArchive::DirArchive(const string &filename, const OpenMode mode):
        m_filename(filename), m_mode(mode), m_createdDirectories()
    {
        // make sure that the base directory exists
        if(m_mode != Read)
        {
            struct stat dirStat;
            const int result(stat(filename.c_str(), &dirStat));
            if(result == 0) // found that name
            {
                // not a directory
                if(!(dirStat.st_mode & S_IFDIR))
                {
                    stringstream msg;
                    msg << "Error opening directory for write (file already exists)";
                    throw runtime_error(msg.str());
                }
            }
            else
                createDirectory(m_filename);
        }

        // populate the list of found file names. first, strip all
        // trailing slashes; this will never return npos because the
        // directory always has at least one slash
        const size_t stripLength(m_filename.find_last_not_of('/') + 1);
        const string stripped(m_filename.substr(0, stripLength));
        searchDirectory(stripped);
    }